

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::DeviceContextVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::operator=
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  DeviceContextVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (DeviceContextVkImpl *)0x0) {
      RefCountedObject<Diligent::IDeviceContextVk>::Release
                ((RefCountedObject<Diligent::IDeviceContextVk> *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (DeviceContextVkImpl *)0x0) {
      RefCountedObject<Diligent::IDeviceContextVk>::AddRef
                ((RefCountedObject<Diligent::IDeviceContextVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }